

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void ppc_POWER7_cpu_family_class_init(CPUClass *oc,void *data)

{
  oc[1].do_interrupt = ppc_pvr_match_power7;
  oc[1].do_unaligned_access =
       (_func_void_CPUState_ptr_vaddr_MMUAccessType_int_uintptr_t_conflict *)0xc000000000000002;
  oc[1].get_arch_id = (_func_int64_t_CPUState_ptr_conflict *)0x6;
  oc[1].cpu_exec_interrupt = init_proc_POWER7;
  oc[1].adjust_watchpoint_address = check_pow_nocheck;
  oc->has_work = cpu_has_work_POWER7;
  oc[1].get_memory_mapping =
       (_func_void_CPUState_ptr_MemoryMappingList_ptr_conflict *)0x8000600fe1ff7ae1;
  oc[1].set_pc = (_func_void_CPUState_ptr_vaddr_conflict *)0x50fb6;
  oc[1].synchronize_from_tb =
       (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x800000000280ff37;
  oc[1].tlb_fill =
       (_func__Bool_CPUState_ptr_vaddr_int_MMUAccessType_int__Bool_uintptr_t_conflict *)
       0xe07f80003e007a0d;
  oc[1].tlb_fill_cpu =
       (_func__Bool_CPUState_ptr_vaddr_int_MMUAccessType_int__Bool_uintptr_t_conflict *)0x7000;
  oc[1].tcg_initialize = ppc_hash64_handle_mmu_fault;
  oc[1].debug_excp_handler = (_func_void_CPUState_ptr_conflict *)&ppc_hash64_opts_POWER7;
  *(undefined4 *)&oc[1].cpu_exec_exit = 0x20;
  oc[1].get_phys_page_debug = (_func_hwaddr_CPUState_ptr_vaddr_conflict *)0xe00010003;
  oc[1].get_phys_page_attrs_debug =
       (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0xe049200000005;
  *(undefined8 *)((long)&oc[1].asidx_from_attrs + 4) = 0x800000008000;
  oc[2].reset = ppc_cpu_interrupts_big_endian_lpcr;
  return;
}

Assistant:

POWERPC_FAMILY(POWER7)(CPUClass *oc, void *data)
{
    PowerPCCPUClass *pcc = POWERPC_CPU_CLASS(oc);
    CPUClass *cc = CPU_CLASS(oc);

//    dc->fw_name = "PowerPC,POWER7";
//    dc->desc = "POWER7";
    pcc->pvr_match = ppc_pvr_match_power7;
    pcc->pcr_mask = PCR_VEC_DIS | PCR_VSX_DIS | PCR_COMPAT_2_05;
    pcc->pcr_supported = PCR_COMPAT_2_06 | PCR_COMPAT_2_05;
    pcc->init_proc = init_proc_POWER7;
    pcc->check_pow = check_pow_nocheck;
    cc->has_work = cpu_has_work_POWER7;
    pcc->insns_flags = PPC_INSNS_BASE | PPC_ISEL | PPC_STRING | PPC_MFTB |
                       PPC_FLOAT | PPC_FLOAT_FSEL | PPC_FLOAT_FRES |
                       PPC_FLOAT_FSQRT | PPC_FLOAT_FRSQRTE |
                       PPC_FLOAT_FRSQRTES |
                       PPC_FLOAT_STFIWX |
                       PPC_FLOAT_EXT |
                       PPC_CACHE | PPC_CACHE_ICBI | PPC_CACHE_DCBZ |
                       PPC_MEM_SYNC | PPC_MEM_EIEIO |
                       PPC_MEM_TLBIE | PPC_MEM_TLBSYNC |
                       PPC_64B | PPC_64H | PPC_64BX | PPC_ALTIVEC |
                       PPC_SEGMENT_64B | PPC_SLBI |
                       PPC_POPCNTB | PPC_POPCNTWD |
                       PPC_CILDST;
    pcc->insns_flags2 = PPC2_VSX | PPC2_DFP | PPC2_DBRX | PPC2_ISA205 |
                        PPC2_PERM_ISA206 | PPC2_DIVE_ISA206 |
                        PPC2_ATOMIC_ISA206 | PPC2_FP_CVT_ISA206 |
                        PPC2_FP_TST_ISA206 | PPC2_FP_CVT_S64 |
                        PPC2_PM_ISA206;
    pcc->msr_mask = (1ull << MSR_SF) |
                    (1ull << MSR_VR) |
                    (1ull << MSR_VSX) |
                    (1ull << MSR_EE) |
                    (1ull << MSR_PR) |
                    (1ull << MSR_FP) |
                    (1ull << MSR_ME) |
                    (1ull << MSR_FE0) |
                    (1ull << MSR_SE) |
                    (1ull << MSR_DE) |
                    (1ull << MSR_FE1) |
                    (1ull << MSR_IR) |
                    (1ull << MSR_DR) |
                    (1ull << MSR_PMM) |
                    (1ull << MSR_RI) |
                    (1ull << MSR_LE);
    pcc->lpcr_mask = LPCR_VPM0 | LPCR_VPM1 | LPCR_ISL | LPCR_DPFD |
        LPCR_VRMASD | LPCR_RMLS | LPCR_ILE |
        LPCR_P7_PECE0 | LPCR_P7_PECE1 | LPCR_P7_PECE2 |
        LPCR_MER | LPCR_TC |
        LPCR_LPES0 | LPCR_LPES1 | LPCR_HDICE;
    pcc->lpcr_pm = LPCR_P7_PECE0 | LPCR_P7_PECE1 | LPCR_P7_PECE2;
    pcc->mmu_model = POWERPC_MMU_2_06;
    pcc->handle_mmu_fault = ppc_hash64_handle_mmu_fault;
    pcc->hash64_opts = &ppc_hash64_opts_POWER7;
    pcc->lrg_decr_bits = 32;
    pcc->excp_model = POWERPC_EXCP_POWER7;
    pcc->bus_model = PPC_FLAGS_INPUT_POWER7;
    pcc->flags = POWERPC_FLAG_VRE | POWERPC_FLAG_SE |
                 POWERPC_FLAG_BE | POWERPC_FLAG_PMM |
                 POWERPC_FLAG_BUS_CLK | POWERPC_FLAG_CFAR |
                 POWERPC_FLAG_VSX;
    pcc->l1_dcache_size = 0x8000;
    pcc->l1_icache_size = 0x8000;
    pcc->interrupts_big_endian = ppc_cpu_interrupts_big_endian_lpcr;
}